

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  char *pcVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  char *pcVar3;
  ostringstream os;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar1 = (txt->_M_dataplus)._M_p;
  uVar2 = extraout_RDX;
  for (pcVar3 = pcVar1; pcVar3 != pcVar1 + txt->_M_string_length; pcVar3 = pcVar3 + 1) {
    transformed_abi_cxx11_(&local_1c0,(lest *)(ulong)(uint)(int)*pcVar3,(char)uVar2);
    std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    pcVar1 = (txt->_M_dataplus)._M_p;
    uVar2 = extraout_RDX_00;
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,local_1c0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1c0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1c0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,local_1c0.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_1c0._M_string_length;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_tran_string( std::string const & txt )
{
    std::ostringstream os;
    for( std::string::const_iterator pos = txt.begin(); pos != txt.end(); ++pos )
        os << transformed( *pos );
    return os.str();
}